

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

ssize_t __thiscall Socket::send(Socket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  
  sVar1 = sendto(this->SocketFileDescriptor,(void *)CONCAT44(in_register_00000034,__fd),
                 (long)(int)__buf,0x4000,(sockaddr *)&this->remoteSockAddr,0x10);
  if ((int)sVar1 < 0) {
    this->SocketFileDescriptor = -1;
  }
  return sVar1;
}

Assistant:

int Socket::send(void const *buffer, int len) {
  //XTRACE(IPC, DEB, "Socket::send(), length %d bytes", len);
  int ret =
      sendto(SocketFileDescriptor, buffer, len, SEND_FLAGS, (struct sockaddr *)&remoteSockAddr, sizeof(remoteSockAddr));
  if (ret < 0) {
    SocketFileDescriptor = -1;
    //XTRACE(IPC, DEB, "sendto() failed with code %d", ret);
  }

  return ret;
}